

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeWorkList
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  Op opcode;
  bool bVar1;
  uint32_t uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  Instruction *this_00;
  uint32_t var_id;
  uint32_t var_id_1;
  uint32_t local_40;
  uint32_t local_3c;
  _List_node_base *local_38;
  
  AddToWorklist(this,(func->def_inst_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  MarkFunctionParameterAsLive(this,func);
  MarkBlockAsLive(this,*(Instruction **)
                        ((long)(((func->blocks_).
                                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                               ._M_t + 8));
  p_Var4 = (structured_order->
           super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)structured_order;
  if (p_Var4 != (_List_node_base *)structured_order) {
    do {
      p_Var3 = p_Var4[1]._M_next;
      for (this_00 = (Instruction *)p_Var3[2]._M_next;
          this_00 != (Instruction *)((long)(p_Var3 + 1) + 8U);
          this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        opcode = this_00->opcode_;
        bVar1 = spvOpcodeIsBranch(opcode);
        if ((!bVar1) &&
           ((9 < opcode - OpLoopMerge || ((0x203U >> (opcode - OpLoopMerge & 0x1f) & 1) == 0)))) {
          if (opcode - OpCopyMemory < 2) {
            local_40 = 0;
            uVar2 = (this_00->has_result_id_ & 1) + 1;
            if (this_00->has_type_id_ == false) {
              uVar2 = (uint)this_00->has_result_id_;
            }
            uVar2 = Instruction::GetSingleWordOperand(this_00,uVar2);
            MemPass::GetPtr(&this->super_MemPass,uVar2,&local_40);
            uVar2 = local_40;
LAB_005252a1:
            bVar1 = IsLocalVar(this,uVar2,func);
          }
          else {
            if (opcode == OpStore) {
              local_3c = 0;
              MemPass::GetPtr(&this->super_MemPass,this_00,&local_3c);
              uVar2 = local_3c;
              goto LAB_005252a1;
            }
            bVar1 = Instruction::IsOpcodeSafeToDelete(this_00);
          }
          if (bVar1 == false) {
            AddToWorklist(this,this_00);
          }
        }
        p_Var3 = p_Var4[1]._M_next;
      }
      p_Var4 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != local_38);
  }
  return;
}

Assistant:

void AggressiveDCEPass::InitializeWorkList(
    Function* func, std::list<BasicBlock*>& structured_order) {
  AddToWorklist(&func->DefInst());
  MarkFunctionParameterAsLive(func);
  MarkFirstBlockAsLive(func);

  // Add instructions with external side effects to the worklist. Also add
  // branches that are not attached to a structured construct.
  // TODO(s-perron): The handling of branch seems to be adhoc.  This needs to be
  // cleaned up.
  for (auto& bi : structured_order) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      spv::Op op = ii->opcode();
      if (ii->IsBranch()) {
        continue;
      }
      switch (op) {
        case spv::Op::OpStore: {
          uint32_t var_id = 0;
          (void)GetPtr(&*ii, &var_id);
          if (!IsLocalVar(var_id, func)) AddToWorklist(&*ii);
        } break;
        case spv::Op::OpCopyMemory:
        case spv::Op::OpCopyMemorySized: {
          uint32_t var_id = 0;
          uint32_t target_addr_id =
              ii->GetSingleWordInOperand(kCopyMemoryTargetAddrInIdx);
          (void)GetPtr(target_addr_id, &var_id);
          if (!IsLocalVar(var_id, func)) AddToWorklist(&*ii);
        } break;
        case spv::Op::OpLoopMerge:
        case spv::Op::OpSelectionMerge:
        case spv::Op::OpUnreachable:
          break;
        default: {
          // Function calls, atomics, function params, function returns, etc.
          if (!ii->IsOpcodeSafeToDelete()) {
            AddToWorklist(&*ii);
          }
        } break;
      }
    }
  }
}